

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiAreaPrivate::activateHighlightedWindow(QMdiAreaPrivate *this)

{
  bool bVar1;
  QMdiAreaPrivate *in_RDI;
  QMdiSubWindow *in_stack_00000008;
  int in_stack_00000028;
  int in_stack_0000002c;
  WindowOrder in_stack_00000030;
  int in_stack_00000034;
  QMdiAreaPrivate *in_stack_00000038;
  qsizetype in_stack_ffffffffffffffe8;
  QMdiAreaPrivate *this_00;
  
  if (-1 < in_RDI->indexToHighlighted) {
    this_00 = in_RDI;
    bVar1 = QBasicTimer::isActive(&in_RDI->tabToPreviousTimer);
    if (bVar1) {
      nextVisibleSubWindow
                (in_stack_00000038,in_stack_00000034,in_stack_00000030,in_stack_0000002c,
                 in_stack_00000028);
      activateWindow(this_00,in_stack_00000008);
    }
    else {
      QList<QPointer<QMdiSubWindow>_>::at
                ((QList<QPointer<QMdiSubWindow>_> *)in_RDI,in_stack_ffffffffffffffe8);
      ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x611836);
      activateWindow(this_00,in_stack_00000008);
    }
    hideRubberBand(in_RDI);
  }
  return;
}

Assistant:

void QMdiAreaPrivate::activateHighlightedWindow()
{
    if (indexToHighlighted < 0)
        return;

    Q_ASSERT(indexToHighlighted < childWindows.size());
    if (tabToPreviousTimer.isActive())
        activateWindow(nextVisibleSubWindow(-1, QMdiArea::ActivationHistoryOrder));
    else
        activateWindow(childWindows.at(indexToHighlighted));
#if QT_CONFIG(rubberband)
    hideRubberBand();
#endif
}